

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O3

fb_symbol_t * lookup_reference(fb_parser_t *P,fb_scope_t *local,fb_ref_t *name,fb_ref_t **enumval)

{
  fb_root_schema_t *pfVar1;
  size_t sVar2;
  fb_ref_t *pfVar3;
  fb_ref_t *pfVar4;
  int iVar5;
  fb_symbol_t *pfVar6;
  void *pvVar7;
  fb_scope_t *pfVar8;
  long lVar9;
  fb_ref_t *pfVar10;
  size_t len;
  fb_ref_t *pfVar11;
  
  if (name == (fb_ref_t *)0x0) {
    pfVar11 = (fb_ref_t *)0x0;
    pfVar10 = (fb_ref_t *)0x0;
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    pfVar3 = (fb_ref_t *)0x0;
    pfVar4 = name;
    do {
      pfVar10 = pfVar4;
      pfVar11 = pfVar3;
      iVar5 = iVar5 + 1;
      pfVar3 = pfVar10;
      pfVar4 = pfVar10->link;
    } while (pfVar10->link != (fb_symbol_t *)0x0);
  }
  if (enumval != (fb_ref_t **)0x0) {
    iVar5 = iVar5 + -1;
    *enumval = pfVar10;
    pfVar10 = pfVar11;
  }
  if (pfVar10 != (fb_ref_t *)0x0) {
    if ((local == (fb_scope_t *)0x0) || (iVar5 != 1)) {
      pfVar1 = (P->schema).root_schema;
      if (pfVar1 != (fb_root_schema_t *)0x0) {
        if (iVar5 + -1 == 0) {
          name = (fb_ref_t *)0x0;
        }
        pfVar8 = fb_scope_table_find(&pfVar1->scope_index,name,(long)-(iVar5 + -1));
        if (pfVar8 == (fb_scope_t *)0x0) {
          return (fb_symbol_t *)0x0;
        }
        pfVar6 = fb_symbol_table_find
                           (&pfVar8->symbol_index,pfVar10->ident->text,pfVar10->ident->len);
        if (((pfVar6 != (fb_symbol_t *)0x0) && (pfVar6->kind < 5)) &&
           (pvVar7 = ptr_set_find_item(&(P->schema).visible_schema,pfVar6[1].ident),
           pvVar7 != (void *)0x0)) {
          return pfVar6;
        }
      }
    }
    else {
      while( true ) {
        pfVar6 = fb_symbol_table_find(&local->symbol_index,pfVar10->ident->text,pfVar10->ident->len)
        ;
        if (((pfVar6 != (fb_symbol_t *)0x0) && (pfVar6->kind < 5)) &&
           (pvVar7 = ptr_set_find_item(&(P->schema).visible_schema,pfVar6[1].ident),
           pvVar7 != (void *)0x0)) {
          return pfVar6;
        }
        lVar9 = -1;
        pfVar8 = local;
        sVar2 = 1;
        do {
          len = sVar2;
          pfVar8 = (fb_scope_t *)pfVar8->name;
          lVar9 = lVar9 + 1;
          sVar2 = len - 1;
        } while (pfVar8 != (fb_scope_t *)0x0);
        if ((int)lVar9 == 0) break;
        do {
          if (lVar9 < 2) {
            pfVar1 = (P->schema).root_schema;
            if (pfVar1 == (fb_root_schema_t *)0x0) {
              return (fb_symbol_t *)0x0;
            }
            pfVar8 = fb_scope_table_find(&pfVar1->scope_index,(void *)0x0,0);
            break;
          }
          pfVar1 = (P->schema).root_schema;
          if (pfVar1 == (fb_root_schema_t *)0x0) {
            pfVar8 = (fb_scope_t *)0x0;
          }
          else {
            pfVar8 = fb_scope_table_find(&pfVar1->scope_index,local->name,len);
          }
          len = len + 1;
          lVar9 = lVar9 + -1;
        } while (pfVar8 == (fb_scope_t *)0x0);
        local = pfVar8;
        if (pfVar8 == (fb_scope_t *)0x0) {
          return (fb_symbol_t *)0x0;
        }
      }
    }
  }
  return (fb_symbol_t *)0x0;
}

Assistant:

static inline fb_symbol_t *lookup_reference(fb_parser_t *P, fb_scope_t *local, fb_ref_t *name, fb_ref_t **enumval)
{
    fb_ref_t *basename, *last, *p;
    fb_scope_t *scope;
    fb_symbol_t *sym;
    int count;

    count = 0;
    scope = 0;
    p = name;
    last = 0;
    basename = 0;
    while (p) {
        basename = last;
        last = p;
        p = p->link;
        ++count;
    }
    if (enumval) {
        --count;
        *enumval = last;
    } else {
        basename = last;
    }
    if (!basename) {
        return 0;
    }
    if (local && count == 1) {
        do {
            if ((sym = find_fb_symbol_by_token(&local->symbol_index, basename->ident))) {
                if (get_compound_if_visible(&P->schema, sym)) {
                    return sym;
                }
            }
            local = find_parent_scope(P, local);
        } while (local);
        return 0;
    }
    /* Null name is valid in scope lookup, indicating global scope. */
    if (count == 1) {
        name = 0;
    }
    if (!(scope = fb_find_scope_by_ref(&P->schema, name, count - 1))) {
        return 0;
    }
    sym = find_fb_symbol_by_token(&scope->symbol_index, basename->ident);
    if (sym && get_compound_if_visible(&P->schema, sym)) {
        return sym;
    }
    return 0;
}